

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.h
# Opt level: O3

void __thiscall TadsMessage::TadsMessage(TadsMessage *this,char *typ,OS_Event *quit_evt)

{
  OS_Counter *pOVar1;
  OS_Event *pOVar2;
  
  (this->super_CVmRefCntObj).cnt.cnt.super___atomic_base<long>._M_i = 1;
  (this->super_CVmRefCntObj)._vptr_CVmRefCntObj = (_func_int **)&PTR__TadsMessage_0034ae90;
  this->typ = typ;
  this->nxt = (TadsMessage *)0x0;
  pOVar2 = (OS_Event *)operator_new(0x88);
  (pOVar2->super_CVmRefCntObj).cnt.cnt.super___atomic_base<long>._M_i = 1;
  (pOVar2->super_CVmRefCntObj)._vptr_CVmRefCntObj = (_func_int **)&PTR__OS_Event_0034aac8;
  (pOVar2->super_OS_Waitable)._vptr_OS_Waitable = (_func_int **)&PTR__OS_Event_0034aaf0;
  pOVar2->manual_reset = 0;
  pOVar2->cnt = 0;
  pthread_cond_init((pthread_cond_t *)&pOVar2->cond,(pthread_condattr_t *)0x0);
  pthread_mutex_init((pthread_mutex_t *)&pOVar2->mutex,(pthread_mutexattr_t *)0x0);
  pOVar2->sub_head = (osu_waitsub *)0x0;
  pOVar2->sub_tail = (osu_waitsub *)0x0;
  this->ev = pOVar2;
  this->completed = 0;
  this->quit_evt = quit_evt;
  if (quit_evt != (OS_Event *)0x0) {
    LOCK();
    pOVar1 = &(quit_evt->super_CVmRefCntObj).cnt;
    (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + 1;
    UNLOCK();
  }
  return;
}

Assistant:

TadsMessage(const char *typ, OS_Event *quit_evt)
    {
        /* remember the message type */
        this->typ = typ;
        
        /* we're not in a queue yet */
        nxt = 0;

        /* set up an event to signal completion of the message */
        ev = new OS_Event(FALSE);
        completed = FALSE;

        /* remember the quit event */
        if ((this->quit_evt = quit_evt) != 0)
            quit_evt->add_ref();
    }